

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Glucose::Solver::addClause_(Solver *this,vec<Glucose::Lit> *ps)

{
  byte bVar1;
  lbool *plVar2;
  int iVar3;
  CRef CVar4;
  Ref RVar5;
  ulong uVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  Lit *pLVar13;
  long lVar14;
  uint uVar15;
  bool bVar16;
  CRef cr;
  vec<Glucose::Lit> local_48;
  CRef local_34;
  
  if (this->ok == true) {
    sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(ps->data);
    local_48.data = (Lit *)0x0;
    local_48.sz = 0;
    local_48.cap = 0;
    uVar6 = (ulong)(uint)ps->sz;
    if ((0 < ps->sz & this->certifiedUNSAT) == 1) {
      pLVar13 = ps->data;
      lVar14 = 0;
      lVar11 = 0;
      bVar7 = false;
      do {
        vec<Glucose::Lit>::push(&local_48,(Lit *)((long)&pLVar13->x + lVar14));
        pLVar13 = ps->data;
        iVar3 = *(int *)((long)&pLVar13->x + lVar14);
        bVar1 = (this->assigns).data[iVar3 >> 1].value;
        bVar8 = (byte)iVar3 & 1;
        if ((bVar1 ^ bVar8) == 1) {
          bVar7 = true;
        }
        if (bVar1 == bVar8) {
          bVar7 = true;
        }
        if (iVar3 == -1) {
          bVar7 = true;
        }
        lVar11 = lVar11 + 1;
        uVar6 = (ulong)ps->sz;
        lVar14 = lVar14 + 4;
      } while (lVar11 < (long)uVar6);
      bVar7 = !bVar7;
    }
    else {
      bVar7 = true;
    }
    iVar3 = (int)uVar6;
    if (0 < iVar3) {
      pLVar13 = ps->data;
      plVar2 = (this->assigns).data;
      lVar11 = 0;
      uVar15 = 0xfffffffe;
      iVar12 = 0;
      do {
        uVar10 = pLVar13[lVar11].x;
        bVar1 = plVar2[(int)uVar10 >> 1].value;
        bVar8 = (byte)uVar10 & 1;
        bVar16 = true;
        if ((bVar1 == bVar8) || ((uVar10 ^ uVar15) == 1)) goto LAB_0010b8ab;
        if (((bVar1 ^ bVar8) != 1) && (uVar10 != uVar15)) {
          lVar14 = (long)iVar12;
          iVar12 = iVar12 + 1;
          pLVar13[lVar14].x = uVar10;
          uVar6 = (ulong)(uint)ps->sz;
          uVar15 = uVar10;
        }
        lVar11 = lVar11 + 1;
        iVar3 = (int)uVar6;
      } while (lVar11 < iVar3);
      if (0 < (int)lVar11 - iVar12) {
        iVar3 = (iVar3 + iVar12) - (int)lVar11;
        ps->sz = iVar3;
      }
    }
    if ((!bVar7) && (this->certifiedUNSAT == true)) {
      if (this->vbyte == false) {
        if (0 < iVar3) {
          lVar11 = 0;
          do {
            uVar15 = ps->data[lVar11].x;
            uVar9 = (int)uVar15 >> 1;
            uVar10 = ~uVar9;
            if ((uVar15 & 1) == 0) {
              uVar10 = uVar9 + 1;
            }
            fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar10);
            lVar11 = lVar11 + 1;
          } while (lVar11 < ps->sz);
        }
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
        fwrite("d ",2,1,(FILE *)this->certifiedOutput);
        if (0 < local_48.sz) {
          lVar11 = 0;
          do {
            uVar10 = local_48.data[lVar11].x >> 1;
            uVar15 = ~uVar10;
            if ((local_48.data[lVar11].x & 1U) == 0) {
              uVar15 = uVar10 + 1;
            }
            fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar15);
            lVar11 = lVar11 + 1;
          } while (lVar11 < local_48.sz);
        }
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
      }
      else {
        write_char(this,'a');
        if (0 < ps->sz) {
          lVar11 = 0;
          do {
            write_lit(this,ps->data[lVar11].x + 2);
            lVar11 = lVar11 + 1;
          } while (lVar11 < ps->sz);
        }
        write_char(this,'\0');
        write_char(this,'d');
        if (0 < local_48.sz) {
          lVar11 = 0;
          do {
            write_lit(this,local_48.data[lVar11].x + 2);
            lVar11 = lVar11 + 1;
          } while (lVar11 < local_48.sz);
        }
        write_char(this,'\0');
      }
    }
    iVar3 = ps->sz;
    if (iVar3 == 1) {
      iVar3 = ps->data->x;
      (this->assigns).data[iVar3 >> 1].value = (byte)iVar3 & 1;
      (this->vardata).data[iVar3 >> 1] =
           (VarData)((ulong)(uint)(this->trail_lim).sz << 0x20 | 0xffffffff);
      iVar12 = (this->trail).sz;
      (this->trail).sz = iVar12 + 1;
      (this->trail).data[iVar12].x = iVar3;
      CVar4 = propagate(this);
      bVar16 = CVar4 == 0xffffffff;
      this->ok = bVar16;
    }
    else if (iVar3 == 0) {
      this->ok = false;
      bVar16 = false;
    }
    else {
      uVar15 = (uint)(byte)(this->ca).super_RegionAllocator<unsigned_int>.field_0x14;
      RVar5 = RegionAllocator<unsigned_int>::alloc
                        (&(this->ca).super_RegionAllocator<unsigned_int>,iVar3 + uVar15 + 3);
      Clause::Clause<Glucose::vec<Glucose::Lit>>
                ((Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + RVar5),ps,uVar15
                 ,false);
      local_34 = RVar5;
      vec<unsigned_int>::push(&this->clauses,&local_34);
      attachClause(this,local_34);
      bVar16 = true;
    }
LAB_0010b8ab:
    if (local_48.data != (Lit *)0x0) {
      local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
      free(local_48.data);
    }
  }
  else {
    bVar16 = false;
  }
  return bVar16;
}

Assistant:

bool Solver::addClause_(vec <Lit> &ps) {

    assert(decisionLevel() == 0);
    if(!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);

    vec <Lit> oc;
    oc.clear();

    Lit p;
    int i, j, flag = 0;
    if(certifiedUNSAT) {
        for(i = j = 0, p = lit_Undef; i < ps.size(); i++) {
            oc.push(ps[i]);
            if(value(ps[i]) == l_True || ps[i] == ~p || value(ps[i]) == l_False)
                flag = 1;
        }
    }

    for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if(value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if(value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if(flag && (certifiedUNSAT)) {
        if(vbyte) {
            write_char('a');
            for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
                write_lit(2 * (var(ps[i]) + 1) + sign(ps[i]));
            write_lit(0);

            write_char('d');
            for(i = j = 0, p = lit_Undef; i < oc.size(); i++)
                write_lit(2 * (var(oc[i]) + 1) + sign(oc[i]));
            write_lit(0);
        }
        else {
            for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
                fprintf(certifiedOutput, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
            fprintf(certifiedOutput, "0\n");

            fprintf(certifiedOutput, "d ");
            for(i = j = 0, p = lit_Undef; i < oc.size(); i++)
                fprintf(certifiedOutput, "%i ", (var(oc[i]) + 1) * (-2 * sign(oc[i]) + 1));
            fprintf(certifiedOutput, "0\n");
        }
    }


    if(ps.size() == 0)
        return ok = false;
    else if(ps.size() == 1) {
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    } else {
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}